

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptError.cpp
# Opt level: O0

DWORD Js::JavascriptError::GetAdjustedResourceStringHr(DWORD hr,bool isFormatString)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ushort local_10;
  WORD scodeIncr;
  bool isFormatString_local;
  DWORD hr_local;
  
  if (((hr >> 0x10 & 0x1fff) != 10) && ((hr >> 0x10 & 0x1fff) != 0x902)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptError.cpp"
                                ,0x13,
                                "(10 == (((hr) >> 16) & 0x1fff) || 2306 == (((hr) >> 16) & 0x1fff))"
                                ,
                                "Chakra hr are either FACILITY_CONTROL (for private HRs) or FACILITY_JSCRIPT (for public HRs)"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_10 = 0;
  if (isFormatString) {
    local_10 = 10000;
  }
  if ((hr >> 0x10 & 0x1fff) == 0x902) {
    local_10 = local_10 + 20000;
  }
  return local_10 + hr;
}

Assistant:

DWORD JavascriptError::GetAdjustedResourceStringHr(DWORD hr, bool isFormatString)
    {
        AssertMsg(FACILITY_CONTROL == HRESULT_FACILITY(hr) || FACILITY_JSCRIPT == HRESULT_FACILITY(hr), "Chakra hr are either FACILITY_CONTROL (for private HRs) or FACILITY_JSCRIPT (for public HRs)");
        WORD scodeIncr = isFormatString ? RTERROR_STRINGFORMAT_OFFSET : 0; // default for FACILITY_CONTROL == HRESULT_FACILITY(hr)
        if (FACILITY_JSCRIPT == HRESULT_FACILITY(hr))
        {
            scodeIncr += RTERROR_PUBLIC_RESOURCEOFFSET;
        }

        hr += scodeIncr;

        return hr;
    }